

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

int vtresize(int force,int newrow,int newcol)

{
  score *psVar1;
  video **ppvVar2;
  video *pvVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  void *tmp_5;
  void *tmp_4;
  void *tmp_3;
  void *tmp_2;
  void *tmp_1;
  void *tmp;
  video *pvStack_30;
  int vidstart;
  video *vp;
  int colchanged;
  int rowchanged;
  int i;
  int newcol_local;
  int newrow_local;
  int force_local;
  
  if ((newrow < 1) || (newcol < 1)) {
    newrow_local = 0;
  }
  else {
    bVar5 = newrow != nrow;
    bVar6 = newcol != ncol;
    if ((((vtresize::first_run != 0) || (force != 0)) || (bVar5)) || (bVar6)) {
      if (vtresize::first_run != 0) {
        memset(&blanks,0,0x18);
      }
      if ((bVar5) || (vtresize::first_run != 0)) {
        if (nrow == 0) {
          tmp._4_4_ = 0;
        }
        else {
          tmp._4_4_ = (nrow + -1) * 2;
        }
        if (newrow < nrow) {
          for (colchanged = (newrow + -1) * 2;
              SBORROW4(colchanged,(nrow + -1) * 2) != colchanged + (nrow + -1) * -2 < 0;
              colchanged = colchanged + 1) {
            free(video[colchanged].v_text);
            video[colchanged].v_text = (char *)0x0;
          }
        }
        psVar1 = (score *)reallocarray(score,(long)newrow,(long)newrow * 0xc);
        if (psVar1 == (score *)0x0) {
          panic("out of memory in display code");
        }
        score = psVar1;
        ppvVar2 = (video **)reallocarray(vscreen,(long)(newrow + -1),8);
        if (ppvVar2 == (video **)0x0) {
          panic("out of memory in display code");
        }
        vscreen = ppvVar2;
        ppvVar2 = (video **)reallocarray(pscreen,(long)(newrow + -1),8);
        if (ppvVar2 == (video **)0x0) {
          panic("out of memory in display code");
        }
        pscreen = ppvVar2;
        pvVar3 = (video *)reallocarray(video,(long)(newrow + -1),0x30);
        if (pvVar3 == (video *)0x0) {
          panic("out of memory in display code");
        }
        video = pvVar3;
        for (colchanged = tmp._4_4_;
            SBORROW4(colchanged,(newrow + -1) * 2) != colchanged + (newrow + -1) * -2 < 0;
            colchanged = colchanged + 1) {
          memset(video + colchanged,0,0x18);
        }
        pvStack_30 = video;
        for (colchanged = 0; colchanged < newrow + -1; colchanged = colchanged + 1) {
          vscreen[colchanged] = pvStack_30;
          pscreen[colchanged] = pvStack_30 + 1;
          pvStack_30 = pvStack_30 + 2;
        }
      }
      if (((bVar5) || (bVar6)) || (pcVar4 = blanks.v_text, vtresize::first_run != 0)) {
        for (colchanged = 0;
            SBORROW4(colchanged,(newrow + -1) * 2) != colchanged + (newrow + -1) * -2 < 0;
            colchanged = colchanged + 1) {
          pcVar4 = (char *)realloc(video[colchanged].v_text,(long)newcol);
          if (pcVar4 == (char *)0x0) {
            panic("out of memory in display code");
          }
          video[colchanged].v_text = pcVar4;
        }
        pcVar4 = (char *)realloc(blanks.v_text,(long)newcol);
        if (pcVar4 == (char *)0x0) {
          panic("out of memory in display code");
        }
      }
      blanks.v_text = pcVar4;
      if (newrow < ttrow) {
        ttrow = newrow;
      }
      if (newcol < ttcol) {
        ttcol = newcol;
      }
      vtresize::first_run = 0;
      newrow_local = 1;
      nrow = newrow;
      ncol = newcol;
    }
    else {
      newrow_local = 1;
    }
  }
  return newrow_local;
}

Assistant:

int
vtresize(int force, int newrow, int newcol)
{
	int	 i;
	int	 rowchanged, colchanged;
	static	 int first_run = 1;
	struct video	*vp;

	if (newrow < 1 || newcol < 1)
		return (FALSE);

	rowchanged = (newrow != nrow);
	colchanged = (newcol != ncol);

#define TRYREALLOC(a, n) do {					\
		void *tmp;					\
		if ((tmp = realloc((a), (n))) == NULL) {	\
			panic("out of memory in display code");	\
		}						\
		(a) = tmp;					\
	} while (0)

#define TRYREALLOCARRAY(a, n, m) do {				\
		void *tmp;					\
		if ((tmp = reallocarray((a), (n), (m))) == NULL) {\
			panic("out of memory in display code");	\
		}						\
		(a) = tmp;					\
	} while (0)

	/* No update needed */
	if (!first_run && !force && !rowchanged && !colchanged)
		return (TRUE);

	if (first_run)
		memset(&blanks, 0, sizeof(blanks));

	if (rowchanged || first_run) {
		int vidstart;

		/*
		 * This is not pretty.
		 */
		if (nrow == 0)
			vidstart = 0;
		else
			vidstart = 2 * (nrow - 1);

		/*
		 * We're shrinking, free some internal data.
		 */
		if (newrow < nrow) {
			for (i = 2 * (newrow - 1); i < 2 * (nrow - 1); i++) {
				free(video[i].v_text);
				video[i].v_text = NULL;
			}
		}

		TRYREALLOCARRAY(score, newrow, newrow * sizeof(struct score));
		TRYREALLOCARRAY(vscreen, (newrow - 1), sizeof(struct video *));
		TRYREALLOCARRAY(pscreen, (newrow - 1), sizeof(struct video *));
		TRYREALLOCARRAY(video, (newrow - 1), 2 * sizeof(struct video));

		/*
		 * Zero-out the entries we just allocated.
		 */
		for (i = vidstart; i < 2 * (newrow - 1); i++)
			memset(&video[i], 0, sizeof(struct video));

		/*
		 * Reinitialize vscreen and pscreen arrays completely.
		 */
		vp = &video[0];
		for (i = 0; i < newrow - 1; ++i) {
			vscreen[i] = vp;
			++vp;
			pscreen[i] = vp;
			++vp;
		}
	}
	if (rowchanged || colchanged || first_run) {
		for (i = 0; i < 2 * (newrow - 1); i++)
			TRYREALLOC(video[i].v_text, newcol);
		TRYREALLOC(blanks.v_text, newcol);
	}

	nrow = newrow;
	ncol = newcol;

	if (ttrow > nrow)
		ttrow = nrow;
	if (ttcol > ncol)
		ttcol = ncol;

	first_run = 0;
	return (TRUE);
}